

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreditCard.cpp
# Opt level: O2

void __thiscall CreditCard::CreditCard(CreditCard *this)

{
  Transaction::Transaction(&this->super_Transaction);
  (this->super_Transaction)._vptr_Transaction = (_func_int **)&PTR_display_00107d10;
  (this->cardNumber)._M_dataplus._M_p = (pointer)&(this->cardNumber).field_2;
  (this->cardNumber)._M_string_length = 0;
  (this->cardNumber).field_2._M_local_buf[0] = '\0';
  (this->expirationDate)._M_dataplus._M_p = (pointer)&(this->expirationDate).field_2;
  (this->expirationDate)._M_string_length = 0;
  (this->expirationDate).field_2._M_local_buf[0] = '\0';
  (this->cvv)._M_dataplus._M_p = (pointer)&(this->cvv).field_2;
  (this->cvv)._M_string_length = 0;
  (this->cvv).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&this->cardNumber);
  std::__cxx11::string::assign((char *)&this->expirationDate);
  std::__cxx11::string::assign((char *)&this->cvv);
  return;
}

Assistant:

CreditCard::CreditCard()
{
    cardNumber = "0000 0000 0000 0000";
    expirationDate = "01/01/2020";
    cvv = "000";
}